

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionContext.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionContext::cmGeneratorExpressionContext
          (cmGeneratorExpressionContext *this,cmLocalGenerator *lg,string *config,bool quiet,
          cmGeneratorTarget *headTarget,cmGeneratorTarget *currentTarget,bool evaluateForBuildsystem
          ,cmListFileBacktrace *backtrace,string *language)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  (this->Backtrace).Context.Name._M_dataplus._M_p = (pointer)&(this->Backtrace).Context.Name.field_2
  ;
  pcVar2 = (backtrace->Context).Name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + (backtrace->Context).Name._M_string_length);
  (this->Backtrace).Context.Line = (backtrace->Context).Line;
  uVar3 = *(undefined4 *)((long)&(backtrace->Snapshot).State + 4);
  uVar4 = *(undefined4 *)&(backtrace->Snapshot).Position.Tree;
  uVar5 = *(undefined4 *)((long)&(backtrace->Snapshot).Position.Tree + 4);
  *(undefined4 *)&(this->Backtrace).Snapshot.State = *(undefined4 *)&(backtrace->Snapshot).State;
  *(undefined4 *)((long)&(this->Backtrace).Snapshot.State + 4) = uVar3;
  *(undefined4 *)&(this->Backtrace).Snapshot.Position.Tree = uVar4;
  *(undefined4 *)((long)&(this->Backtrace).Snapshot.Position.Tree + 4) = uVar5;
  (this->Backtrace).Snapshot.Position.Position = (backtrace->Snapshot).Position.Position;
  p_Var1 = &(this->DependTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AllTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->LG = lg;
  (this->Config)._M_dataplus._M_p = (pointer)&(this->Config).field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Config,pcVar2,pcVar2 + config->_M_string_length);
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  pcVar2 = (language->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Language,pcVar2,pcVar2 + language->_M_string_length);
  this->HeadTarget = headTarget;
  this->CurrentTarget = currentTarget;
  this->Quiet = quiet;
  this->HadError = false;
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  this->EvaluateForBuildsystem = evaluateForBuildsystem;
  return;
}

Assistant:

cmGeneratorExpressionContext::cmGeneratorExpressionContext(
      cmLocalGenerator* lg, std::string const& config,
      bool quiet, cmGeneratorTarget const* headTarget,
      const cmGeneratorTarget* currentTarget,
      bool evaluateForBuildsystem,
      cmListFileBacktrace const& backtrace,
      std::string const& language)
  : Backtrace(backtrace),
    LG(lg),
    Config(config),
    Language(language),
    HeadTarget(headTarget),
    CurrentTarget(currentTarget),
    Quiet(quiet),
    HadError(false),
    HadContextSensitiveCondition(false),
    HadHeadSensitiveCondition(false),
    EvaluateForBuildsystem(evaluateForBuildsystem)
{
}